

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printConditional(JSPrinter *this,Ref node)

{
  size_t sVar1;
  undefined8 *puVar2;
  uint uVar3;
  Ref local_20;
  Ref node_local;
  
  uVar3 = (uint)&local_20;
  local_20.inst = node.inst;
  puVar2 = (undefined8 *)cashew::Ref::operator[](uVar3);
  printChild(this,(Value *)*puVar2,local_20,-1);
  space(this);
  maybeSpace(this,'?');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '?';
  space(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[](uVar3);
  printChild(this,(Value *)*puVar2,local_20,0);
  space(this);
  maybeSpace(this,':');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = ':';
  space(this);
  puVar2 = (undefined8 *)cashew::Ref::operator[](uVar3);
  printChild(this,(Value *)*puVar2,local_20,1);
  return;
}

Assistant:

void printConditional(Ref node) {
    printChild(node[1], node, -1);
    space();
    emit('?');
    space();
    printChild(node[2], node, 0);
    space();
    emit(':');
    space();
    printChild(node[3], node, 1);
  }